

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  Curl_easy *pCVar1;
  CURLMcode CVar2;
  CURLMcode CVar3;
  Curl_tree *pCVar4;
  Curl_easy *data;
  byte bVar5;
  curltime now_00;
  curltime cVar6;
  curltime now;
  Curl_tree *t;
  curltime local_e8;
  uint *local_d8;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  cVar6 = Curl_now();
  local_e8.tv_sec = cVar6.tv_sec;
  local_e8.tv_usec = cVar6.tv_usec;
  CVar3 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar3 = CURLM_RECURSIVE_API_CALL, (multi->field_0x1b1 & 4) == 0)) {
    data = multi->easyp;
    if (data == (Curl_easy *)0x0) {
      CVar3 = CURLM_OK;
    }
    else {
      bVar5 = (data->set).field_0x8be;
      local_d8 = (uint *)running_handles;
      sigpipe_ignore(data,(sigpipe_ignore *)local_d0);
      CVar3 = CURLM_OK;
      do {
        pCVar1 = data->next;
        if ((*(uint *)&(data->set).field_0x8be & 1) != (uint)(bVar5 & 1)) {
          if (local_38 == '\0') {
            sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
          }
          sigpipe_ignore(data,(sigpipe_ignore *)local_d0);
          bVar5 = (data->set).field_0x8be;
        }
        CVar2 = multi_runsingle(multi,&local_e8,data);
        running_handles = (int *)local_d8;
        if (CVar2 != CURLM_OK) {
          CVar3 = CVar2;
        }
        data = pCVar1;
      } while (pCVar1 != (Curl_easy *)0x0);
      if (local_38 == '\0') {
        sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
      }
    }
    do {
      cVar6.tv_usec = local_e8.tv_usec;
      cVar6.tv_sec = local_e8.tv_sec;
      cVar6._12_4_ = 0;
      pCVar4 = Curl_splaygetbest(cVar6,multi->timetree,(Curl_tree **)&local_d0[0].sa_handler);
      multi->timetree = pCVar4;
      if (local_d0[0].sa_handler == (__sighandler_t)0x0) break;
      now_00.tv_usec = local_e8.tv_usec;
      now_00.tv_sec = local_e8.tv_sec;
      now_00._12_4_ = 0;
      add_next_timeout(now_00,multi,*(Curl_easy **)(local_d0[0].sa_handler + 0x30));
    } while (local_d0[0].sa_handler != (__sighandler_t)0x0);
    *running_handles = multi->num_alive;
    if (CVar3 < CURLM_BAD_HANDLE) {
      CVar3 = Curl_update_timer(multi);
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  if(data) {
    CURLMcode result;
    bool nosig = data->set.no_signal;
    SIGPIPE_VARIABLE(pipe_st);
    sigpipe_ignore(data, &pipe_st);
    /* Do the loop and only alter the signal ignore state if the next handle
       has a different NO_SIGNAL state than the previous */
    do {
      /* the current node might be unlinked in multi_runsingle(), get the next
         pointer now */
      struct Curl_easy *datanext = data->next;
      if(data->set.no_signal != nosig) {
        sigpipe_restore(&pipe_st);
        sigpipe_ignore(data, &pipe_st);
        nosig = data->set.no_signal;
      }
      result = multi_runsingle(multi, &now, data);
      if(result)
        returncode = result;
      data = datanext; /* operate on next handle */
    } while(data);
    sigpipe_restore(&pipe_st);
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    returncode = Curl_update_timer(multi);

  return returncode;
}